

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O1

energy_t __thiscall W_final::hfold(W_final *this,sparse_tree *tree)

{
  ulong uVar1;
  pointer pNVar2;
  s_energy_matrix *psVar3;
  pointer piVar4;
  bool bVar5;
  energy_t eVar6;
  int iVar7;
  long lVar8;
  seq_interval *psVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  int local_a4;
  int local_98;
  int local_94;
  ulong local_90;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  int local_58 [4];
  long local_48 [2];
  ulong local_38;
  
  local_a4 = this->n;
  uVar17 = (ulong)local_a4;
  if (0 < (long)uVar17) {
    local_90 = uVar17 << 5 | 6;
    do {
      local_a4 = local_a4 + -1;
      uVar11 = local_90;
      uVar13 = uVar17;
      iVar15 = local_a4;
      if ((long)uVar17 <= (long)this->n) {
        do {
          iVar16 = (int)uVar17;
          iVar14 = (int)uVar13;
          bVar5 = sparse_tree::weakly_closed(tree,iVar16,iVar14);
          pNVar2 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar19 = true;
          bVar18 = true;
          if ((ulong)(uint)pNVar2[uVar17].pair != 0xffffffff) {
            bVar18 = *(int *)((long)&pNVar2->parent + uVar11 * 2) == -1;
          }
          if (uVar13 == (uint)pNVar2[uVar17].pair) {
            bVar19 = uVar17 != *(uint *)((long)&pNVar2->parent + uVar11 * 2);
          }
          if ((((~bVar5 & 1U) == 0 && !bVar18) &&
               0 < (short)pair[this->S_[uVar17]][this->S_[uVar13]]) &&
             ((bVar19 & this->pk_only) == 0)) {
            s_energy_matrix::compute_energy_restricted(this->V,iVar16,iVar14,tree);
          }
          if (this->pk_free == false) {
            pseudo_loop::compute_energies(this->WMB,iVar16,iVar14,tree);
          }
          psVar3 = this->V;
          eVar6 = pseudo_loop::get_WMB(this->WMB,iVar16,iVar14);
          s_energy_matrix::compute_WMv_WMp(psVar3,iVar16,iVar14,eVar6,&tree->tree);
          s_energy_matrix::compute_energy_WM_restricted(this->V,iVar16,iVar14,tree,&this->WMB->WMB);
          iVar15 = iVar15 + 1;
          uVar11 = uVar11 + 0x20;
          uVar13 = uVar13 + 1;
        } while (iVar15 < this->n);
      }
      local_90 = local_90 - 0x20;
      bVar5 = 1 < (long)uVar17;
      uVar17 = uVar17 - 1;
    } while (bVar5);
  }
  iVar15 = this->n;
  if (3 < iVar15) {
    local_68 = 1;
    uVar17 = 4;
    local_94 = 3;
    do {
      local_98 = 10000000;
      iVar15 = 10000000;
      if ((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17].pair < 0) {
        iVar15 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17 - 1];
      }
      iVar14 = 10000000;
      uVar11 = uVar17;
      if (4 < uVar17) {
        local_38 = uVar17 - 1;
        local_98 = 10000000;
        uVar13 = 0;
        iVar16 = local_94;
        local_60 = uVar17;
        do {
          uVar11 = local_60;
          uVar17 = uVar13 + 1;
          iVar7 = 0;
          if (1 < uVar17) {
            iVar7 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar13];
          }
          psVar3 = this->V;
          local_6c = 10000000;
          local_58[0] = 10000000;
          if (uVar17 < local_60) {
            local_58[0] = (psVar3->nodes).
                          super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [(psVar3->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar13 + 1] + iVar16].energy;
          }
          uVar1 = uVar13 + 2;
          if (uVar1 < local_60) {
            local_6c = (psVar3->nodes).
                       super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(psVar3->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13 + 2] + iVar16 + -1].energy;
          }
          local_74 = 10000000;
          local_70 = 10000000;
          if (uVar13 + 1 < local_38) {
            local_70 = (psVar3->nodes).
                       super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(psVar3->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13 + 1] + iVar16 + -1].energy;
          }
          if (uVar1 < local_38) {
            local_74 = (psVar3->nodes).
                       super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(psVar3->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13 + 2] + iVar16 + -2].energy;
          }
          eVar6 = E_ext_Stem(this,local_58,&local_6c,&local_70,&local_74,this->S_,this->params_,
                             (cand_pos_t)(uVar13 + 1),(cand_pos_t)local_60,this->n,&tree->tree);
          iVar12 = eVar6 + iVar7;
          if (iVar14 <= eVar6 + iVar7) {
            iVar12 = iVar14;
          }
          iVar14 = iVar12;
          iVar12 = (int)uVar13;
          if ((uVar13 + 1 == 1) ||
             ((bVar5 = sparse_tree::weakly_closed(tree,1,iVar12), uVar11 = local_60, bVar5 &&
              (bVar5 = sparse_tree::weakly_closed(tree,iVar12 + 1,(int)local_60), bVar5)))) {
            eVar6 = pseudo_loop::get_WMB(this->WMB,iVar12 + 1,(cand_pos_t)uVar11);
            iVar7 = eVar6 + iVar7 + PS_penalty;
            if (iVar7 < local_98) {
              local_98 = iVar7;
            }
          }
          iVar16 = iVar16 + -1;
          uVar11 = local_60;
          uVar13 = uVar17;
        } while (uVar1 != local_68);
      }
      local_58[0] = iVar15;
      local_58[1] = iVar14;
      local_58[2] = local_98;
      lVar8 = 4;
      piVar10 = local_58;
      do {
        if (*(int *)((long)local_58 + lVar8) < *piVar10) {
          piVar10 = (int *)((long)local_58 + lVar8);
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = *piVar10;
      uVar17 = uVar11 + 1;
      iVar15 = this->n;
      local_68 = local_68 + 1;
      local_94 = local_94 + 1;
    } while ((long)uVar11 < (long)iVar15);
  }
  piVar4 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  eVar6 = piVar4[iVar15];
  psVar9 = (seq_interval *)operator_new(0x18);
  this->stack_interval = psVar9;
  psVar9->i = 1;
  psVar9->j = iVar15;
  psVar9->energy = piVar4[iVar15];
  psVar9->type = 'W';
  psVar9->next = (seq_interval *)0x0;
  while (psVar9 = this->stack_interval, psVar9 != (seq_interval *)0x0) {
    this->stack_interval = psVar9->next;
    backtrack_restricted(this,psVar9,tree);
    operator_delete(psVar9,0x18);
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)&this->structure);
  std::__cxx11::string::operator=((string *)&this->structure,(string *)local_58);
  if ((long *)CONCAT44(local_58[1],local_58[0]) != local_48) {
    operator_delete((long *)CONCAT44(local_58[1],local_58[0]),local_48[0] + 1);
  }
  return eVar6;
}

Assistant:

energy_t W_final::hfold(sparse_tree &tree){

		for (int i = n; i >=1; --i)
		{	
			for (int j =i; j<=n; ++j)//for (i=0; i<=j; i++)
			{
				const bool evaluate = tree.weakly_closed(i,j);
				const pair_type ptype_closing = pair[S_[i]][S_[j]];
				const bool restricted = tree.tree[i].pair == -1 || tree.tree[j].pair == -1;
				const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);

				const bool pkonly = (!pk_only || paired);

				if(ptype_closing> 0 && evaluate && !restricted && pkonly)
				V->compute_energy_restricted (i,j,tree);

				if(!pk_free) WMB->compute_energies(i,j,tree);


				V->compute_WMv_WMp(i,j,WMB->get_WMB(i,j),tree.tree);
				V->compute_energy_WM_restricted(i,j,tree,WMB->WMB);
			}

		}

	for (cand_pos_t j= TURN+1; j <= n; j++){
		energy_t m1 = INF;
		energy_t m2 = INF;
		energy_t m3 = INF;
		if(tree.tree[j].pair < 0) m1 = W[j-1];
		
		
		for (cand_pos_t k=1; k<=j-TURN-1; ++k){
		 	// m2 = compute_W_br2_restricted (j, fres, must_choose_this_branch);
			energy_t acc = (k>1) ? W[k-1]: 0;
			m2 = std::min(m2,acc + E_ext_Stem(V->get_energy(k,j),V->get_energy(k+1,j),V->get_energy(k,j-1),V->get_energy(k+1,j-1),S_,params_,k,j,n,tree.tree));
			if (k == 1 || (tree.weakly_closed(1,k-1) && tree.weakly_closed(k,j))) m3 = std::min(m3,acc + WMB->get_WMB(k,j) + PS_penalty);
			}
		W[j] = std::min({m1,m2,m3});
	}

    energy_t energy = W[n];

    // backtrack
    // first add (1,n) on the stack
    stack_interval = new seq_interval;
    stack_interval->i = 1;
    stack_interval->j = n;
    stack_interval->energy = W[n];
    stack_interval->type = FREE;
    stack_interval->next = NULL;

    seq_interval *cur_interval = stack_interval;

    while ( cur_interval != NULL)
    {
        stack_interval = stack_interval->next;
        backtrack_restricted (cur_interval,tree);
        delete cur_interval;    // this should make up for the new in the insert_node
        cur_interval = stack_interval;
    }
	this->structure = structure.substr(1,n);
    return energy;

}